

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<_drmModeModeInfo>::reallocateAndGrow
          (QArrayDataPointer<_drmModeModeInfo> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<_drmModeModeInfo> *old)

{
  long lVar1;
  bool bVar2;
  QPodArrayOps<_drmModeModeInfo> *this_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<_drmModeModeInfo> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<_drmModeModeInfo> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  _drmModeModeInfo *in_stack_ffffffffffffff80;
  _drmModeModeInfo *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<_drmModeModeInfo> *)in_stack_ffffffffffffff80), bVar2)
      ) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<_drmModeModeInfo> *)0xaaaaaaaaaaaaaaaa,-0x5555555555555556,
                 0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<_drmModeModeInfo> *)in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<_drmModeModeInfo> *)
                  operator->((QArrayDataPointer<_drmModeModeInfo> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<_drmModeModeInfo> *)0x110b8c);
        begin((QArrayDataPointer<_drmModeModeInfo> *)0x110b9b);
        QtPrivate::QPodArrayOps<_drmModeModeInfo>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (_drmModeModeInfo *)
             operator->((QArrayDataPointer<_drmModeModeInfo> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<_drmModeModeInfo> *)0x110bd1);
        begin((QArrayDataPointer<_drmModeModeInfo> *)0x110be0);
        QtPrivate::QPodArrayOps<_drmModeModeInfo>::moveAppend
                  ((QPodArrayOps<_drmModeModeInfo> *)in_stack_ffffffffffffff80,
                   (_drmModeModeInfo *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                   ,(_drmModeModeInfo *)0x110bfb);
      }
    }
    swap((QArrayDataPointer<_drmModeModeInfo> *)in_stack_ffffffffffffff80,
         (QArrayDataPointer<_drmModeModeInfo> *)
         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<_drmModeModeInfo> *)in_stack_ffffffffffffff80,
           (QArrayDataPointer<_drmModeModeInfo> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer((QArrayDataPointer<_drmModeModeInfo> *)in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<_drmModeModeInfo> *)in_stack_ffffffffffffff80);
    freeSpaceAtEnd((QArrayDataPointer<_drmModeModeInfo> *)in_stack_ffffffffffffff88);
    QtPrivate::QPodArrayOps<_drmModeModeInfo>::reallocate
              ((QPodArrayOps<_drmModeModeInfo> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }